

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageQualifiersTests.cpp
# Opt level: O1

TestCaseGroup * vkt::image::createImageQualifiersTests(TestContext *testCtx)

{
  image *this;
  ImageType imageType;
  TestCase *node;
  int iVar1;
  TestNode *this_00;
  TestNode *this_01;
  TestNode *node_00;
  ImageType imageType_00;
  char *name;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  TextureFormat *extraout_RDX_02;
  TextureFormat *extraout_RDX_03;
  TextureFormat *extraout_RDX_04;
  TextureFormat *extraout_RDX_05;
  TextureFormat *extraout_RDX_06;
  TextureFormat *format;
  undefined8 extraout_RDX_07;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  string formatName;
  MovePtr<vkt::TestCase,_de::DefaultDeleter<vkt::TestCase>_> restrictCase;
  UVec3 imageSize;
  string local_98;
  TestNode *local_78;
  TestContext *local_70;
  ImageType local_64;
  MovePtr<vkt::TestCase,_de::DefaultDeleter<vkt::TestCase>_> local_60;
  _func_int **local_50;
  _Alloc_hider local_40;
  uint local_38;
  
  local_78 = (TestNode *)operator_new(0x70);
  local_70 = testCtx;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_78,testCtx,"qualifiers","Coherent, volatile and restrict");
  if (createImageQualifiersTests(tcu::TestContext&)::imageParamsArray == '\0') {
    createImageQualifiersTests();
  }
  if (createImageQualifiersTests(tcu::TestContext&)::formats == '\0') {
    createImageQualifiersTests();
  }
  iVar1 = 0;
  do {
    this_00 = (TestNode *)operator_new(0x70);
    name = "restrict";
    if (iVar1 == 1) {
      name = "volatile";
    }
    if (iVar1 == 0) {
      name = "coherent";
    }
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)this_00,local_70,name,"");
    lVar4 = 0;
    uVar2 = extraout_RDX;
    do {
      imageType = createImageQualifiersTests::imageParamsArray[lVar4].m_imageType;
      local_38 = createImageQualifiersTests::imageParamsArray[lVar4].m_imageSize.m_data[2];
      local_40._M_p =
           *(pointer *)createImageQualifiersTests::imageParamsArray[lVar4].m_imageSize.m_data;
      if (iVar1 == 2) {
        getImageTypeName_abi_cxx11_(&local_98,(image *)(ulong)imageType,(ImageType)uVar2);
        createImageQualifierRestrictCase(&local_60,local_70,imageType,&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        node = local_60.super_UniqueBase<vkt::TestCase,_de::DefaultDeleter<vkt::TestCase>_>.m_data.
               ptr;
        local_60.super_UniqueBase<vkt::TestCase,_de::DefaultDeleter<vkt::TestCase>_>.m_data.ptr =
             (TestCase *)0x0;
        tcu::TestNode::addChild(this_00,(TestNode *)node);
        uVar2 = extraout_RDX_00;
        if ((TestNode *)
            local_60.super_UniqueBase<vkt::TestCase,_de::DefaultDeleter<vkt::TestCase>_>.m_data.ptr
            != (TestNode *)0x0) {
          (*(*(_func_int ***)
              &(local_60.super_UniqueBase<vkt::TestCase,_de::DefaultDeleter<vkt::TestCase>_>.m_data.
               ptr)->super_TestCase)[1])();
          local_60.super_UniqueBase<vkt::TestCase,_de::DefaultDeleter<vkt::TestCase>_>.m_data.ptr =
               (TestCase *)0x0;
          uVar2 = extraout_RDX_01;
        }
      }
      else {
        this_01 = (TestNode *)operator_new(0x70);
        getImageTypeName_abi_cxx11_(&local_98,(image *)(ulong)imageType,imageType_00);
        tcu::TestCaseGroup::TestCaseGroup
                  ((TestCaseGroup *)this_01,local_70,local_98._M_dataplus._M_p,"");
        format = extraout_RDX_02;
        local_64 = imageType;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          format = extraout_RDX_03;
        }
        lVar3 = 0;
        do {
          this = (image *)((long)&createImageQualifiersTests::formats[0].order + lVar3);
          getShaderImageFormatQualifier_abi_cxx11_(&local_98,this,format);
          node_00 = (TestNode *)operator_new(0x90);
          local_60.super_UniqueBase<vkt::TestCase,_de::DefaultDeleter<vkt::TestCase>_>.m_data.ptr =
               (TestCase *)&stack0xffffffffffffffb0;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"");
          tcu::TestCase::TestCase
                    ((TestCase *)node_00,local_70,local_98._M_dataplus._M_p,
                     (char *)local_60.
                             super_UniqueBase<vkt::TestCase,_de::DefaultDeleter<vkt::TestCase>_>.
                             m_data.ptr);
          node_00->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d2cee8;
          *(int *)&node_00[1]._vptr_TestNode = iVar1;
          *(ImageType *)((long)&node_00[1]._vptr_TestNode + 4) = local_64;
          node_00[1].m_testCtx = (TestContext *)local_40._M_p;
          *(uint *)&node_00[1].m_name._M_dataplus._M_p = local_38;
          *(undefined8 *)((long)&node_00[1].m_name._M_dataplus._M_p + 4) = *(undefined8 *)this;
          *(undefined4 *)((long)&node_00[1].m_name._M_string_length + 4) = 0xc;
          tcu::TestNode::addChild(this_01,node_00);
          format = extraout_RDX_04;
          if ((TestNode *)
              local_60.super_UniqueBase<vkt::TestCase,_de::DefaultDeleter<vkt::TestCase>_>.m_data.
              ptr != (TestNode *)&stack0xffffffffffffffb0) {
            operator_delete(local_60.
                            super_UniqueBase<vkt::TestCase,_de::DefaultDeleter<vkt::TestCase>_>.
                            m_data.ptr,(long)local_50 + 1);
            format = extraout_RDX_05;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
            format = extraout_RDX_06;
          }
          lVar3 = lVar3 + 8;
        } while (lVar3 != 0x18);
        tcu::TestNode::addChild(this_00,this_01);
        uVar2 = extraout_RDX_07;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 8);
    tcu::TestNode::addChild(local_78,this_00);
    iVar1 = iVar1 + 1;
  } while (iVar1 != 3);
  return (TestCaseGroup *)local_78;
}

Assistant:

tcu::TestCaseGroup* createImageQualifiersTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> imageQualifiersTests(new tcu::TestCaseGroup(testCtx, "qualifiers", "Coherent, volatile and restrict"));

	struct ImageParams
	{
		ImageParams(const ImageType imageType, const tcu::UVec3& imageSize)
			: m_imageType	(imageType)
			, m_imageSize	(imageSize)
		{
		}
		ImageType	m_imageType;
		tcu::UVec3	m_imageSize;
	};

	static const ImageParams imageParamsArray[] =
	{
		ImageParams(IMAGE_TYPE_1D,			tcu::UVec3(64u, 1u,  1u)),
		ImageParams(IMAGE_TYPE_1D_ARRAY,	tcu::UVec3(64u, 1u,  8u)),
		ImageParams(IMAGE_TYPE_2D,			tcu::UVec3(64u, 64u, 1u)),
		ImageParams(IMAGE_TYPE_2D_ARRAY,	tcu::UVec3(64u, 64u, 8u)),
		ImageParams(IMAGE_TYPE_3D,			tcu::UVec3(64u, 64u, 8u)),
		ImageParams(IMAGE_TYPE_CUBE,		tcu::UVec3(64u, 64u, 1u)),
		ImageParams(IMAGE_TYPE_CUBE_ARRAY,	tcu::UVec3(64u, 64u, 2u)),
		ImageParams(IMAGE_TYPE_BUFFER,		tcu::UVec3(64u, 1u,  1u))
	};

	static const tcu::TextureFormat formats[] =
	{
		tcu::TextureFormat(tcu::TextureFormat::R, tcu::TextureFormat::FLOAT),
		tcu::TextureFormat(tcu::TextureFormat::R, tcu::TextureFormat::UNSIGNED_INT32),
		tcu::TextureFormat(tcu::TextureFormat::R, tcu::TextureFormat::SIGNED_INT32),
	};

	for (deUint32 qualifierI = 0; qualifierI < MemoryQualifierTestCase::QUALIFIER_LAST; ++qualifierI)
	{
		const MemoryQualifierTestCase::Qualifier	memoryQualifier		= (MemoryQualifierTestCase::Qualifier)qualifierI;
		const char* const							memoryQualifierName =
			memoryQualifier == MemoryQualifierTestCase::QUALIFIER_COHERENT ? "coherent" :
			memoryQualifier == MemoryQualifierTestCase::QUALIFIER_VOLATILE ? "volatile" :
			memoryQualifier == MemoryQualifierTestCase::QUALIFIER_RESTRICT ? "restrict" :
			DE_NULL;

		de::MovePtr<tcu::TestCaseGroup> qualifierGroup(new tcu::TestCaseGroup(testCtx, memoryQualifierName, ""));

		for (deInt32 imageTypeNdx = 0; imageTypeNdx < DE_LENGTH_OF_ARRAY(imageParamsArray); imageTypeNdx++)
		{
			const ImageType		imageType = imageParamsArray[imageTypeNdx].m_imageType;
			const tcu::UVec3	imageSize = imageParamsArray[imageTypeNdx].m_imageSize;

			if (memoryQualifier == MemoryQualifierTestCase::QUALIFIER_RESTRICT)
			{
				de::MovePtr<TestCase> restrictCase = createImageQualifierRestrictCase(testCtx, imageType, getImageTypeName(imageType));
				qualifierGroup->addChild(restrictCase.release());
			}
			else
			{
				de::MovePtr<tcu::TestCaseGroup> imageTypeGroup(new tcu::TestCaseGroup(testCtx, getImageTypeName(imageType).c_str(), ""));

				for (deInt32 formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(formats); formatNdx++)
				{
					const tcu::TextureFormat&	format		= formats[formatNdx];
					const std::string			formatName	= getShaderImageFormatQualifier(formats[formatNdx]);

					imageTypeGroup->addChild(
						new MemoryQualifierTestCase(testCtx, formatName, "", memoryQualifier, imageType, imageSize, format, glu::GLSL_VERSION_440));
				}

				qualifierGroup->addChild(imageTypeGroup.release());
			}
		}

		imageQualifiersTests->addChild(qualifierGroup.release());
	}

	return imageQualifiersTests.release();
}